

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pluginmanager.cc
# Opt level: O0

void __thiscall Typelib::PluginManager::~PluginManager(PluginManager *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
  local_20;
  __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
  local_18;
  iterator it;
  PluginManager *this_local;
  
  it._M_current = (TypeDefinitionPlugin **)this;
  (anonymous_namespace)::
  clear<std::map<std::__cxx11::string,Typelib::ImportPlugin*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::ImportPlugin*>>>>
            (&this->m_importers);
  (anonymous_namespace)::
  clear<std::map<std::__cxx11::string,Typelib::ExportPlugin*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::ExportPlugin*>>>>
            (&this->m_exporters);
  local_18._M_current =
       (TypeDefinitionPlugin **)
       std::
       vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
       begin(&this->m_definition_plugins);
  while( true ) {
    local_20._M_current =
         (TypeDefinitionPlugin **)
         std::
         vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
         end(&this->m_definition_plugins);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
              ::operator*(&local_18);
    if (*ppTVar2 != (TypeDefinitionPlugin *)0x0) {
      (**(code **)(*(long *)*ppTVar2 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<Typelib::TypeDefinitionPlugin_**,_std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
  clear(&this->m_definition_plugins);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->m_library_handles);
  std::vector<Typelib::TypeDefinitionPlugin_*,_std::allocator<Typelib::TypeDefinitionPlugin_*>_>::
  ~vector(&this->m_definition_plugins);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ImportPlugin_*>_>_>
  ::~map(&this->m_importers);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::ExportPlugin_*>_>_>
  ::~map(&this->m_exporters);
  return;
}

Assistant:

PluginManager::~PluginManager()
{
    clear(m_importers);
    clear(m_exporters);
    for (std::vector<TypeDefinitionPlugin*>::iterator it = m_definition_plugins.begin();
            it != m_definition_plugins.end(); ++it)
        delete *it;
    m_definition_plugins.clear();
    //for (vector<void*>::iterator it = m_library_handles.begin(); it != m_library_handles.end(); ++it)
    //    dlclose(*it);
}